

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O3

vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
* __thiscall
S2Polygon::OperationWithPolyline
          (vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
           *__return_storage_ptr__,S2Polygon *this,OpType op_type,SnapFunction *snap_function,
          S2Polyline *a)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  ostream *os;
  S2Error error;
  MutableS2ShapeIndex a_index;
  _Head_base<0UL,_S2Shape_*,_false> local_170;
  _Head_base<0UL,_S2Builder::Layer_*,_false> local_168;
  S2Error local_160;
  S2LogMessage local_138;
  MutableS2ShapeIndex local_128;
  Options local_d0;
  Options local_a4;
  S2BooleanOperation local_90;
  
  S2BooleanOperation::Options::Options(&local_d0);
  S2BooleanOperation::Options::set_snap_function(&local_d0,snap_function);
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a4.edge_type_ = DIRECTED;
  local_a4.polyline_type_ = WALK;
  local_a4.duplicate_edges_ = KEEP;
  local_a4.sibling_pairs_ = KEEP;
  local_a4.validate_ = false;
  local_a4.s2debug_override_ = ALLOW;
  local_160._0_8_ = __return_storage_ptr__;
  absl::
  make_unique<s2builderutil::S2PolylineVectorLayer,std::vector<std::unique_ptr<S2Polyline,std::default_delete<S2Polyline>>,std::allocator<std::unique_ptr<S2Polyline,std::default_delete<S2Polyline>>>>*,s2builderutil::S2PolylineVectorLayer::Options&>
            ((absl *)&local_128,
             (vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
              **)&local_160,&local_a4);
  local_168._M_head_impl = (Layer *)local_128.super_S2ShapeIndex._vptr_S2ShapeIndex;
  local_128.super_S2ShapeIndex._vptr_S2ShapeIndex = (_func_int **)0x0;
  S2BooleanOperation::S2BooleanOperation
            (&local_90,op_type,
             (unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> *)&local_168,
             &local_d0);
  if (local_168._M_head_impl != (Layer *)0x0) {
    (*(local_168._M_head_impl)->_vptr_Layer[1])();
  }
  local_168._M_head_impl = (Layer *)0x0;
  if (local_128.super_S2ShapeIndex._vptr_S2ShapeIndex != (_func_int **)0x0) {
    (**(code **)(*local_128.super_S2ShapeIndex._vptr_S2ShapeIndex + 8))();
  }
  MutableS2ShapeIndex::MutableS2ShapeIndex(&local_128);
  local_138._0_8_ = a;
  absl::make_unique<S2Polyline::Shape,S2Polyline_const*>
            ((absl *)&local_160,(S2Polyline **)&local_138);
  local_170._M_head_impl = (S2Shape *)local_160._0_8_;
  local_160._0_8_ =
       (vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
        *)0x0;
  MutableS2ShapeIndex::Add
            (&local_128,(unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)&local_170);
  if (local_170._M_head_impl != (S2Shape *)0x0) {
    (*(code *)(((_Vector_base<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
                 *)&(local_170._M_head_impl)->_vptr_S2Shape)->_M_impl).super__Vector_impl_data.
              _M_start[1]._M_t.super___uniq_ptr_impl<S2Polyline,_std::default_delete<S2Polyline>_>.
              _M_t)();
  }
  local_170._M_head_impl = (S2Shape *)0x0;
  if ((vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
       *)local_160._0_8_ !=
      (vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
       *)0x0) {
    (**(code **)(*(long *)&((_Vector_base<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
                             *)local_160._0_8_)->_M_impl + 8))();
  }
  paVar1 = &local_160.text_.field_2;
  local_160._0_8_ = local_160._0_8_ & 0xffffffff00000000;
  local_160.text_._M_string_length = 0;
  local_160.text_.field_2._M_local_buf[0] = '\0';
  local_160.text_._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = S2BooleanOperation::Build
                    (&local_90,&local_128.super_S2ShapeIndex,&(this->index_).super_S2ShapeIndex,
                     &local_160);
  if (bVar2) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.text_._M_dataplus._M_p != paVar1) {
      operator_delete(local_160.text_._M_dataplus._M_p);
    }
    MutableS2ShapeIndex::~MutableS2ShapeIndex(&local_128);
    std::
    vector<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
    ::~vector(&local_90.layers_);
    if (local_90.options_.snap_function_._M_t.
        super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
        ._M_t.
        super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
        .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>)0x0
       ) {
      (*(*(_func_int ***)
          local_90.options_.snap_function_._M_t.
          super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
          ._M_t.
          super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
          .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl)[1])();
    }
    if ((tuple<S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>)
        local_d0.snap_function_._M_t.
        super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
        ._M_t.
        super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
        .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl !=
        (_Head_base<0UL,_S2Builder::SnapFunction_*,_false>)0x0) {
      (*(*(_func_int ***)
          local_d0.snap_function_._M_t.
          super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
          ._M_t.
          super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
          .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl)[1])();
    }
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            (&local_138,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
             ,0x49f,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(local_138.stream_,"Polyline ",9);
  pcVar3 = S2BooleanOperation::OpTypeToString(op_type);
  os = std::operator<<(local_138.stream_,pcVar3);
  std::__ostream_insert<char,std::char_traits<char>>(os," operation failed: ",0x13);
  ::operator<<(os,&local_160);
  abort();
}

Assistant:

vector<unique_ptr<S2Polyline>> S2Polygon::OperationWithPolyline(
    S2BooleanOperation::OpType op_type,
    const S2Builder::SnapFunction& snap_function,
    const S2Polyline& a) const {
  S2BooleanOperation::Options options;
  options.set_snap_function(snap_function);
  vector<unique_ptr<S2Polyline>> result;
  S2PolylineVectorLayer::Options layer_options;
  layer_options.set_polyline_type(
      S2PolylineVectorLayer::Options::PolylineType::WALK);
  S2BooleanOperation op(
      op_type, make_unique<S2PolylineVectorLayer>(&result, layer_options),
      options);
  MutableS2ShapeIndex a_index;
  a_index.Add(make_unique<S2Polyline::Shape>(&a));
  S2Error error;
  if (!op.Build(a_index, index_, &error)) {
    S2_LOG(DFATAL) << "Polyline " << S2BooleanOperation::OpTypeToString(op_type)
                << " operation failed: " << error;
  }
  return result;
}